

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_soup_mesh_builder.cc
# Opt level: O0

void __thiscall draco::TriangleSoupMeshBuilder::Start(TriangleSoupMeshBuilder *this,int num_faces)

{
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *this_00;
  pointer this_01;
  int in_ESI;
  pointer in_RDI;
  Mesh *in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)operator_new(0xd8);
  Mesh::Mesh(in_stack_ffffffffffffffe0);
  std::unique_ptr<draco::Mesh,std::default_delete<draco::Mesh>>::
  unique_ptr<std::default_delete<draco::Mesh>,void>(this_00,in_RDI);
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator=
            (this_00,(unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)in_RDI);
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::~unique_ptr(this_00);
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x192c7a);
  Mesh::SetNumFaces((Mesh *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  this_01 = std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::operator->
                      ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)0x192c94);
  PointCloud::set_num_points(&this_01->super_PointCloud,in_ESI * 3);
  std::vector<signed_char,_std::allocator<signed_char>_>::clear
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x192caa);
  return;
}

Assistant:

void TriangleSoupMeshBuilder::Start(int num_faces) {
  mesh_ = std::unique_ptr<Mesh>(new Mesh());
  mesh_->SetNumFaces(num_faces);
  mesh_->set_num_points(num_faces * 3);
  attribute_element_types_.clear();
}